

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# damerau_levenshtein_distance.cc
# Opt level: O1

uint8_t absl::strings_internal::CappedDamerauLevenshteinDistance
                  (string_view s1,string_view s2,uint8_t cutoff)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  byte *pbVar5;
  long lVar6;
  ulong uVar7;
  byte *pbVar8;
  undefined7 in_register_00000081;
  long lVar9;
  size_t i;
  ulong uVar10;
  ulong uVar11;
  size_t j;
  ulong uVar12;
  char acStack_29a2 [103];
  char acStack_293b [70];
  byte local_28f5 [5];
  ulong local_28f0;
  ulong local_28e8;
  ulong local_28e0;
  byte local_28d5 [10405];
  
  pcVar2 = s2._M_str;
  local_28e0 = s2._M_len;
  uVar11 = s1._M_len;
  uVar10 = 100;
  if (cutoff < 100) {
    uVar10 = CONCAT71(in_register_00000081,cutoff) & 0xffffffff;
  }
  local_28f5[0] = (char)uVar10 + 1;
  pcVar3 = s1._M_str;
  uVar4 = uVar11;
  if (local_28e0 < uVar11) {
    pcVar3 = pcVar2;
    uVar4 = local_28e0;
    pcVar2 = s1._M_str;
    local_28e0 = uVar11;
  }
  local_28f0 = uVar10 & 0xff;
  bVar1 = local_28f5[0];
  if ((local_28e0 < 0x65 && local_28e0 <= local_28f0 + uVar4) &&
     (bVar1 = (byte)local_28e0, uVar4 != 0)) {
    if (local_28d5 + 1 != local_28d5 + local_28f0 + 2) {
      lVar9 = 0;
      do {
        local_28d5[lVar9 + 1] = (byte)lVar9;
        lVar9 = lVar9 + 1;
      } while (local_28f0 + 1 != lVar9);
    }
    local_28d5[uVar10 + 2] = local_28f5[0];
    local_28e8 = (ulong)(byte)(((char)uVar4 - bVar1) + (char)uVar10);
    uVar11 = 1;
    do {
      uVar10 = local_28e0;
      lVar9 = uVar11 * 0x66;
      pbVar5 = local_28d5 + lVar9 + 1;
      uVar12 = uVar11 - local_28e8;
      if (uVar11 < local_28e8 || uVar12 == 0) {
        *pbVar5 = (byte)uVar11;
        uVar12 = 1;
      }
      else {
        pbVar5[uVar12 - 1] = local_28f5[0];
      }
      uVar7 = local_28f0 + uVar11;
      if (uVar7 <= uVar10) {
        pbVar5[uVar7 + 1] = local_28f5[0];
        uVar10 = uVar7;
      }
      if (uVar12 <= uVar10) {
        do {
          local_28f5[4] = local_28f5[0];
          if ((((1 < uVar11) && (1 < uVar12)) && (pcVar3[uVar11 - 1] == pcVar2[uVar12 - 2])) &&
             (pcVar3[uVar11 - 2] == pcVar2[uVar12 - 1])) {
            local_28f5[4] = acStack_29a2[uVar12 + lVar9] + 1;
          }
          local_28f5[1] = acStack_293b[uVar12 + lVar9 + 1] + '\x01';
          local_28f5[2] = local_28d5[uVar12 + lVar9] + 1;
          local_28f5[3] = (pcVar3[uVar11 - 1] != pcVar2[uVar12 - 1]) + acStack_293b[uVar12 + lVar9];
          lVar6 = 1;
          pbVar8 = local_28f5;
          do {
            if (local_28f5[lVar6] < *pbVar8) {
              pbVar8 = local_28f5 + lVar6;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 != 5);
          pbVar5[uVar12] = *pbVar8;
          uVar12 = uVar12 + 1;
        } while (uVar12 <= uVar10);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 <= uVar4);
    bVar1 = local_28d5[local_28e0 + uVar4 * 0x66 + 1];
  }
  return bVar1;
}

Assistant:

uint8_t CappedDamerauLevenshteinDistance(absl::string_view s1,
                                         absl::string_view s2, uint8_t cutoff) {
  const uint8_t MAX_SIZE = 100;
  const uint8_t _cutoff = std::min(MAX_SIZE, cutoff);
  const uint8_t cutoff_plus_1 = static_cast<uint8_t>(_cutoff + 1);

  if (s1.size() > s2.size()) std::swap(s1, s2);
  if (s1.size() + _cutoff < s2.size() || s2.size() > MAX_SIZE)
    return cutoff_plus_1;

  if (s1.empty())
    return static_cast<uint8_t>(s2.size());

  // Lower diagonal bound: y = x - lower_diag
  const uint8_t lower_diag =
      _cutoff - static_cast<uint8_t>(s2.size() - s1.size());
  // Upper diagonal bound: y = x + upper_diag
  const uint8_t upper_diag = _cutoff;

  // d[i][j] is the number of edits required to convert s1[0, i] to s2[0, j]
  std::array<std::array<uint8_t, MAX_SIZE + 2>, MAX_SIZE + 2> d;
  std::iota(d[0].begin(), d[0].begin() + upper_diag + 1, 0);
  d[0][cutoff_plus_1] = cutoff_plus_1;
  for (size_t i = 1; i <= s1.size(); ++i) {
    // Deduce begin of relevant window.
    size_t j_begin = 1;
    if (i > lower_diag) {
      j_begin = i - lower_diag;
      d[i][j_begin - 1] = cutoff_plus_1;
    } else {
      d[i][0] = static_cast<uint8_t>(i);
    }

    // Deduce end of relevant window.
    size_t j_end = i + upper_diag;
    if (j_end > s2.size()) {
      j_end = s2.size();
    } else {
      d[i][j_end + 1] = cutoff_plus_1;
    }

    for (size_t j = j_begin; j <= j_end; ++j) {
      const uint8_t deletion_distance = d[i - 1][j] + 1;
      const uint8_t insertion_distance = d[i][j - 1] + 1;
      const uint8_t mismatched_tail_cost = s1[i - 1] == s2[j - 1] ? 0 : 1;
      const uint8_t mismatch_distance = d[i - 1][j - 1] + mismatched_tail_cost;
      uint8_t transposition_distance = _cutoff + 1;
      if (i > 1 && j > 1 && s1[i - 1] == s2[j - 2] && s1[i - 2] == s2[j - 1])
        transposition_distance = d[i - 2][j - 2] + 1;
      d[i][j] = std::min({cutoff_plus_1, deletion_distance, insertion_distance,
                          mismatch_distance, transposition_distance});
    }
  }
  return d[s1.size()][s2.size()];
}